

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

void Llb_MnxStop(Llb_Mnx_t *p)

{
  int iVar1;
  long lVar2;
  DdNode *pDVar3;
  double local_70;
  double local_60;
  double local_50;
  double local_40;
  double local_30;
  int local_1c;
  int i;
  DdNode *bTemp;
  Llb_Mnx_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    lVar2 = Cudd_ReadReorderingTime(p->dd);
    p->timeReo = lVar2;
    p->timeOther = (p->timeTotal - p->timeImage) - p->timeRemap;
    Abc_Print(1,"%s =","Image    ");
    if (p->timeTotal == 0) {
      local_30 = 0.0;
    }
    else {
      local_30 = ((double)p->timeImage * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeImage * 1.0) / 1000000.0,local_30);
    Abc_Print(1,"%s =","Remap    ");
    if (p->timeTotal == 0) {
      local_40 = 0.0;
    }
    else {
      local_40 = ((double)p->timeRemap * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeRemap * 1.0) / 1000000.0,local_40);
    Abc_Print(1,"%s =","Other    ");
    if (p->timeTotal == 0) {
      local_50 = 0.0;
    }
    else {
      local_50 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeOther * 1.0) / 1000000.0,local_50);
    Abc_Print(1,"%s =","TOTAL    ");
    if (p->timeTotal == 0) {
      local_60 = 0.0;
    }
    else {
      local_60 = ((double)p->timeTotal * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTotal * 1.0) / 1000000.0,local_60);
    Abc_Print(1,"%s =","  reo    ");
    if (p->timeTotal == 0) {
      local_70 = 0.0;
    }
    else {
      local_70 = ((double)p->timeReo * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeReo * 1.0) / 1000000.0,local_70);
  }
  if (p->bBad != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bBad);
  }
  if (p->bReached != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bReached);
  }
  if (p->bCurrent != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bCurrent);
  }
  if (p->bNext != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,p->bNext);
  }
  if (p->vRings != (Vec_Ptr_t *)0x0) {
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vRings), local_1c < iVar1; local_1c = local_1c + 1) {
      pDVar3 = (DdNode *)Vec_PtrEntry(p->vRings,local_1c);
      Cudd_RecursiveDeref(p->dd,pDVar3);
    }
  }
  if (p->vRoots != (Vec_Ptr_t *)0x0) {
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vRoots), local_1c < iVar1; local_1c = local_1c + 1) {
      pDVar3 = (DdNode *)Vec_PtrEntry(p->vRoots,local_1c);
      Cudd_RecursiveDeref(p->dd,pDVar3);
    }
  }
  Vec_PtrFreeP(&p->vRings);
  Vec_PtrFreeP(&p->vRoots);
  Extra_StopManager(p->dd);
  Vec_IntFreeP(&p->vOrder);
  Vec_IntFreeP(&p->vVars2Q);
  if (p != (Llb_Mnx_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Llb_MnxStop( Llb_Mnx_t * p )
{
    DdNode * bTemp;
    int i;
    if ( p->pPars->fVerbose ) 
    {
        p->timeReo = Cudd_ReadReorderingTime(p->dd);
        p->timeOther = p->timeTotal - p->timeImage - p->timeRemap;
        ABC_PRTP( "Image    ", p->timeImage, p->timeTotal );
        ABC_PRTP( "Remap    ", p->timeRemap, p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther, p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal, p->timeTotal );
        ABC_PRTP( "  reo    ", p->timeReo,   p->timeTotal );
    }
    // remove BDDs
    if ( p->bBad )
        Cudd_RecursiveDeref( p->dd, p->bBad );
    if ( p->bReached )
        Cudd_RecursiveDeref( p->dd, p->bReached );
    if ( p->bCurrent )
        Cudd_RecursiveDeref( p->dd, p->bCurrent );
    if ( p->bNext )
        Cudd_RecursiveDeref( p->dd, p->bNext );
	if ( p->vRings )
    Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
        Cudd_RecursiveDeref( p->dd, bTemp );
	if ( p->vRoots )
    Vec_PtrForEachEntry( DdNode *, p->vRoots, bTemp, i )
        Cudd_RecursiveDeref( p->dd, bTemp );
    // remove arrays
    Vec_PtrFreeP( &p->vRings );
    Vec_PtrFreeP( &p->vRoots );
//Cudd_PrintInfo( p->dd, stdout );
    Extra_StopManager( p->dd );
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vVars2Q );
    ABC_FREE( p );
}